

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_nodes.h
# Opt level: O2

node_type * __thiscall
st_tree::detail::
node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>::
_copy_data(node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>
           *this,tree_type *tree_)

{
  node_type *pnVar1;
  tree_type *tree__00;
  pointer ppnVar2;
  node_type *local_30;
  
  pnVar1 = tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>::_new_node
                     ((tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_> *)this);
  tree__00 = (tree_type *)
             &(this->
              super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
              )._data;
  ut_raw::emplace_subnodes::test_method::str1::operator=
            (&(pnVar1->
              super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
              )._data,(str1 *)tree__00);
  if (pnVar1 != this) {
    (pnVar1->
    super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
    )._depth._max =
         (this->
         super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
         )._depth._max;
    tree__00 = (tree_type *)
               &(this->
                super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
                )._depth._hist;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&(pnVar1->
                super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
                )._depth._hist,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)tree__00);
  }
  for (ppnVar2 = (this->
                 super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
                 )._children.
                 super__Vector_base<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppnVar2 !=
      (this->
      super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
      )._children.
      super__Vector_base<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppnVar2 = ppnVar2 + 1) {
    local_30 = _copy_data(*ppnVar2,tree__00);
    tree__00 = (tree_type *)&local_30;
    std::
    vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>
    ::push_back(&(pnVar1->
                 super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
                 )._children,(value_type *)&local_30);
  }
  return pnVar1;
}

Assistant:

node_type* _copy_data(tree_type& tree_) const {
        node_type* n = tree_._new_node();
        n->_data = this->_data;
        n->_depth = this->_depth;
        for (cs_const_iterator j(this->_children.begin()); j != this->_children.end(); ++j)
            n->_children.push_back((*j)->_copy_data(tree_));
        return n;
    }